

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

ArenaMemoryDataSummary * __thiscall
JsUtil::
BaseDictionary<char16_t_*,_ArenaMemoryDataSummary_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Item(BaseDictionary<char16_t_*,_ArenaMemoryDataSummary_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       *this,char16_t **key)

{
  Type piVar1;
  Type pSVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  char16_t *pcVar6;
  undefined4 *puVar7;
  char16_t cVar8;
  uint uVar9;
  uint uVar10;
  hash_t hVar11;
  Type this_00;
  uint depth;
  
  piVar1 = this->buckets;
  depth = 0;
  if (piVar1 != (Type)0x0) {
    pcVar6 = *key;
    cVar8 = *pcVar6;
    if (cVar8 == L'\0') {
      hVar11 = 0x11c9dc5;
    }
    else {
      uVar9 = 0x811c9dc5;
      do {
        pcVar6 = pcVar6 + 1;
        uVar10 = (ushort)cVar8 ^ uVar9;
        uVar9 = uVar10 * 0x1000193;
        cVar8 = *pcVar6;
      } while (cVar8 != L'\0');
      hVar11 = uVar10 * 0x2000326 >> 1;
    }
    hVar11 = PrimePolicy::ModPrime(hVar11,this->bucketCount,this->modFunctionIndex);
    uVar9 = piVar1[hVar11];
    depth = 0;
    if (-1 < (int)uVar9) {
      pSVar2 = this->entries;
      depth = 0;
      do {
        iVar5 = PAL_wcscmp(pSVar2[uVar9].
                           super_DefaultHashedEntry<char16_t_*,_ArenaMemoryDataSummary_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                           .super_KeyValueEntry<char16_t_*,_ArenaMemoryDataSummary_*>.
                           super_ValueEntry<ArenaMemoryDataSummary_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<char16_t_*,_ArenaMemoryDataSummary_*>_>
                           .super_KeyValueEntryDataLayout2<char16_t_*,_ArenaMemoryDataSummary_*>.key
                           ,*key);
        if (iVar5 == 0) {
          this_00 = this->stats;
          goto LAB_0036914d;
        }
        depth = depth + 1;
        uVar9 = pSVar2[uVar9].
                super_DefaultHashedEntry<char16_t_*,_ArenaMemoryDataSummary_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<char16_t_*,_ArenaMemoryDataSummary_*>.
                super_ValueEntry<ArenaMemoryDataSummary_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<char16_t_*,_ArenaMemoryDataSummary_*>_>
                .super_KeyValueEntryDataLayout2<char16_t_*,_ArenaMemoryDataSummary_*>.next;
      } while (-1 < (int)uVar9);
    }
  }
  this_00 = this->stats;
  uVar9 = 0xffffffff;
LAB_0036914d:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,depth);
  }
  if ((int)uVar9 < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0xed,"(i >= 0)","i >= 0");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  return this->entries[(int)uVar9].
         super_DefaultHashedEntry<char16_t_*,_ArenaMemoryDataSummary_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
         .super_KeyValueEntry<char16_t_*,_ArenaMemoryDataSummary_*>.
         super_ValueEntry<ArenaMemoryDataSummary_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<char16_t_*,_ArenaMemoryDataSummary_*>_>
         .super_KeyValueEntryDataLayout2<char16_t_*,_ArenaMemoryDataSummary_*>.value;
}

Assistant:

TValue Item(const TKey& key)
        {
            int i = FindEntry(key);
            Assert(i >= 0);
            return entries[i].Value();
        }